

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::detail::error_handler>::
write_int<unsigned__int128>
          (arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::detail::error_handler> *this,
          unsigned___int128 value,format_specs *spec)

{
  byte bVar1;
  long in_RCX;
  undefined1 local_58 [48];
  char local_28;
  uint local_24;
  
  local_58._0_8_ = *(undefined8 *)this;
  local_58._8_8_ = *(undefined8 *)(this + 8);
  local_24 = 0;
  bVar1 = *(byte *)(in_RCX + 9) >> 4 & 7;
  if (1 < bVar1) {
    local_28 = ' ';
    if (bVar1 == 2) {
      local_28 = '+';
    }
    local_24 = 1;
  }
  local_58._32_8_ = spec;
  handle_int_type_spec<fmt::v6::detail::int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,unsigned__int128>&>
            (*(char *)(in_RCX + 8),
             (int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
              *)local_58);
  *(undefined8 *)this = local_58._0_8_;
  return;
}

Assistant:

void write_int(T value, const format_specs& spec) {
    using uint_type = uint32_or_64_or_128_t<T>;
    int_writer<iterator, char_type, uint_type> w(out_, locale_, value, spec);
    handle_int_type_spec(spec.type, w);
    out_ = w.out;
  }